

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Copy(Compiler *this,Frag arg)

{
  LogMessage *this_00;
  Frag FVar1;
  long in_RDI;
  Compiler *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe74;
  char *in_stack_fffffffffffffe78;
  LogMessage *in_stack_fffffffffffffe80;
  
  LogMessage::LogMessage
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
  this_00 = (LogMessage *)LogMessage::stream((LogMessage *)&stack0xfffffffffffffe68);
  std::operator<<((ostream *)this_00,"Compiler::Copy called!");
  LogMessage::~LogMessage(this_00);
  *(undefined1 *)(in_RDI + 0x20) = 1;
  FVar1 = NoMatch(in_stack_fffffffffffffe38);
  return FVar1;
}

Assistant:

Frag Compiler::Copy(Frag arg) {
  // We're using WalkExponential; there should be no copying.
  LOG(DFATAL) << "Compiler::Copy called!";
  failed_ = true;
  return NoMatch();
}